

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socketio_berkeley.c
# Opt level: O0

void * socketio_CloneOption(char *name,void *value)

{
  undefined1 auVar1 [16];
  int iVar2;
  LOGGER_LOG p_Var3;
  size_t sVar4;
  size_t local_60;
  size_t local_58;
  ulong local_50;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  size_t malloc_size;
  LOGGER_LOG l;
  void *result;
  void *value_local;
  char *name_local;
  
  if (name == (char *)0x0) {
    l = (LOGGER_LOG)0x0;
  }
  else {
    l = (LOGGER_LOG)0x0;
    iVar2 = strcmp(name,"net_interface_mac_address");
    if (iVar2 == 0) {
      if (value == (void *)0x0) {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/deps/c-utility/adapters/socketio_berkeley.c"
                    ,"socketio_CloneOption",0x7e,1,"Failed cloning option %s (value is NULL)",name);
        }
      }
      else {
        sVar4 = strlen((char *)value);
        if (sVar4 < 0xfffffffffffffffe) {
          sVar4 = strlen((char *)value);
          local_50 = sVar4 + 1;
        }
        else {
          local_50 = 0xffffffffffffffff;
        }
        if (local_50 == 0) {
          local_58 = 0;
        }
        else {
          auVar1._8_8_ = 0;
          auVar1._0_8_ = local_50;
          if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) / auVar1,0) == 0) {
            local_60 = 0xffffffffffffffff;
          }
          else {
            local_60 = local_50;
          }
          local_58 = local_60;
        }
        if (local_58 == 0xffffffffffffffff) {
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 != (LOGGER_LOG)0x0) {
            (*p_Var3)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/deps/c-utility/adapters/socketio_berkeley.c"
                      ,"socketio_CloneOption",0x86,1,"Invalid malloc size");
          }
        }
        else {
          l = (LOGGER_LOG)malloc(local_58);
          if (l == (LOGGER_LOG)0x0) {
            p_Var3 = xlogging_get_log_function();
            if (p_Var3 != (LOGGER_LOG)0x0) {
              (*p_Var3)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/deps/c-utility/adapters/socketio_berkeley.c"
                        ,"socketio_CloneOption",0x8a,1,"Failed cloning option %s (malloc failed)",
                        name);
            }
          }
          else {
            strcpy((char *)l,(char *)value);
          }
        }
      }
    }
    else {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/deps/c-utility/adapters/socketio_berkeley.c"
                  ,"socketio_CloneOption",0x94,1,"Cannot clone option %s (not suppported)",name);
      }
    }
  }
  return l;
}

Assistant:

static void* socketio_CloneOption(const char* name, const void* value)
{
    void* result;

    if (name != NULL)
    {
        result = NULL;

        if (strcmp(name, OPTION_NET_INT_MAC_ADDRESS) == 0)
        {
            if (value == NULL)
            {
                LogError("Failed cloning option %s (value is NULL)", name);
            }
            else
            {
                size_t malloc_size = safe_add_size_t(strlen((char*)value), 1);
                malloc_size = safe_multiply_size_t(malloc_size, sizeof(char));
                if (malloc_size == SIZE_MAX)
                {
                    LogError("Invalid malloc size");
                }
                else if ((result = malloc(malloc_size)) == NULL)
                {
                    LogError("Failed cloning option %s (malloc failed)", name);
                }
                else
                {
                    strcpy((char *)result, (char *)value);
                }
            }
        }
        else
        {
            LogError("Cannot clone option %s (not suppported)", name);
        }
    }
    else
    {
        result = NULL;
    }
    return result;
}